

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

bool __thiscall cmDocumentation::PrintHelpListCommands(cmDocumentation *this,ostream *os)

{
  cmDocumentation *this_00;
  undefined1 local_38 [32];
  
  this_00 = (cmDocumentation *)local_38;
  local_38._0_8_ = local_38 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"command/*","");
  PrintNames(this_00,os,(string *)local_38);
  if ((undefined1 *)local_38._0_8_ != local_38 + 0x10) {
    operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
  }
  return true;
}

Assistant:

bool cmDocumentation::PrintHelpListCommands(std::ostream& os)
{
  this->PrintNames(os, "command/*");
  return true;
}